

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall ON_SubDFace::QuadOppositeVertex(ON_SubDFace *this,ON_SubDVertex *vertex)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ON_SubDEdge *e2;
  ON__UINT_PTR ptr2;
  ON_SubDEdge *e0;
  ON__UINT_PTR ptr0;
  ON_SubDVertex *vertex_local;
  ON_SubDFace *this_local;
  
  if (vertex == (ON_SubDVertex *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDFace *)0x0;
  }
  else if (this->m_edge_count == 4) {
    uVar4 = this->m_edge4[0].m_ptr;
    uVar1 = uVar4 & 0xfffffffffffffff8;
    if (uVar1 == 0) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDFace *)0x0;
    }
    else {
      uVar4 = uVar4 & 1;
      uVar3 = this->m_edge4[2].m_ptr;
      uVar2 = uVar3 & 0xfffffffffffffff8;
      if (uVar2 == 0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDFace *)0x0;
      }
      else {
        uVar3 = uVar3 & 1;
        if (vertex == *(ON_SubDVertex **)(uVar1 + 0x80 + uVar4 * 8)) {
          this_local = *(ON_SubDFace **)(uVar2 + 0x80 + uVar3 * 8);
        }
        else if (vertex == *(ON_SubDVertex **)(uVar1 + 0x80 + (1 - uVar4) * 8)) {
          this_local = *(ON_SubDFace **)(uVar2 + 0x80 + (1 - uVar3) * 8);
        }
        else if (vertex == *(ON_SubDVertex **)(uVar2 + 0x80 + uVar3 * 8)) {
          this_local = *(ON_SubDFace **)(uVar1 + 0x80 + uVar4 * 8);
        }
        else if (vertex == *(ON_SubDVertex **)(uVar2 + 0x80 + (1 - uVar3) * 8)) {
          this_local = *(ON_SubDFace **)(uVar1 + 0x80 + (1 - uVar4) * 8);
        }
        else {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubDFace *)0x0;
        }
      }
    }
  }
  else {
    this_local = (ON_SubDFace *)0x0;
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const ON_SubDVertex* ON_SubDFace::QuadOppositeVertex(
  const ON_SubDVertex* vertex
  ) const
{
  if ( nullptr == vertex )
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( 4 != m_edge_count)
    return nullptr; // not an error
  
  ON__UINT_PTR ptr0 = m_edge4[0].m_ptr;
  const ON_SubDEdge* e0 = ON_SUBD_EDGE_POINTER(ptr0);
  if ( nullptr == e0 )
    return ON_SUBD_RETURN_ERROR(nullptr);
  ptr0 = ON_SUBD_EDGE_DIRECTION(ptr0);
  
  ON__UINT_PTR ptr2 = m_edge4[2].m_ptr;
  const ON_SubDEdge* e2 = ON_SUBD_EDGE_POINTER(ptr2);
  if ( nullptr == e2 )
    return ON_SUBD_RETURN_ERROR(nullptr);
  ptr2 = ON_SUBD_EDGE_DIRECTION(ptr2);

  if (vertex == e0->m_vertex[ptr0])
    return e2->m_vertex[ptr2];

  if (vertex == e0->m_vertex[1-ptr0])
    return e2->m_vertex[1-ptr2];

  if (vertex == e2->m_vertex[ptr2])
    return e0->m_vertex[ptr0];

  if (vertex == e2->m_vertex[1-ptr2])
    return e0->m_vertex[1-ptr0];

  return ON_SUBD_RETURN_ERROR(nullptr);
}